

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table_test.cc
# Opt level: O0

void __thiscall StackTraceTableTest_Basic_Test::TestBody(StackTraceTableTest_Basic_Test *this)

{
  undefined1 local_340 [8];
  StackTrace t3;
  StackTrace t2;
  StackTrace t1;
  StackTraceTableTestHelper local_18;
  StackTraceTableTestHelper h;
  StackTraceTableTest_Basic_Test *this_local;
  
  h.head_._M_t.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (EntryPtr)(EntryPtr)this;
  StackTraceTableTestHelper::StackTraceTableTestHelper(&local_18);
  StackTraceTableTestHelper::CheckTracesAndReset(&local_18,TestBody::k1,1);
  t2.stack[0x1e] = (void *)0x400;
  t3.stack[0x1e] = (void *)0x200;
  t2.size = 2;
  t2.depth = 2;
  t2.stack[0] = (void *)0x1;
  StackTraceTableTestHelper::AddTrace(&local_18,(StackTrace *)(t2.stack + 0x1e));
  StackTraceTableTestHelper::CheckTracesAndReset(&local_18,TestBody::k2,6);
  StackTraceTableTestHelper::AddTrace(&local_18,(StackTrace *)(t2.stack + 0x1e));
  StackTraceTableTestHelper::AddTrace(&local_18,(StackTrace *)(t3.stack + 0x1e));
  StackTraceTableTestHelper::CheckTracesAndReset(&local_18,TestBody::k3,0xb);
  local_340 = (undefined1  [8])0x2;
  t3.size = 2;
  t3.depth = 1;
  t3.stack[0] = (void *)0x2;
  StackTraceTableTestHelper::AddTrace(&local_18,(StackTrace *)(t2.stack + 0x1e));
  StackTraceTableTestHelper::AddTrace(&local_18,(StackTrace *)local_340);
  StackTraceTableTestHelper::CheckTracesAndReset(&local_18,TestBody::k5,0xb);
  StackTraceTableTestHelper::~StackTraceTableTestHelper(&local_18);
  return;
}

Assistant:

TEST(StackTraceTableTest, Basic) {
  StackTraceTableTestHelper h;

  // Empty table
  static const uintptr_t k1[] = {0};
  h.CheckTracesAndReset(k1, arraysize(k1));

  tcmalloc::StackTrace t1;
  t1.size = static_cast<uintptr_t>(1024);
  t1.depth = static_cast<uintptr_t>(2);
  t1.stack[0] = reinterpret_cast<void*>(1);
  t1.stack[1] = reinterpret_cast<void*>(2);

  tcmalloc::StackTrace t2;
  t2.size = static_cast<uintptr_t>(512);
  t2.depth = static_cast<uintptr_t>(2);
  t2.stack[0] = reinterpret_cast<void*>(2);
  t2.stack[1] = reinterpret_cast<void*>(1);

  // Table w/ just t1
  h.AddTrace(t1);
  static const uintptr_t k2[] = {1, 1024, 2, 1, 2, 0};
  h.CheckTracesAndReset(k2, arraysize(k2));

  // Table w/ t1, t2
  h.AddTrace(t1);
  h.AddTrace(t2);
  static const uintptr_t k3[] = {1, 512, 2, 2, 1, 1, 1024, 2, 1, 2, 0};
  h.CheckTracesAndReset(k3, arraysize(k3));

  // Table w/ t1, t3
  // Same stack as t1, but w/ different size
  tcmalloc::StackTrace t3;
  t3.size = static_cast<uintptr_t>(2);
  t3.depth = static_cast<uintptr_t>(2);
  t3.stack[0] = reinterpret_cast<void*>(1);
  t3.stack[1] = reinterpret_cast<void*>(2);

  h.AddTrace(t1);
  h.AddTrace(t3);
  static const uintptr_t k5[] = {1, 2, 2, 1, 2, 1, 1024, 2, 1, 2, 0};
  h.CheckTracesAndReset(k5, arraysize(k5));
}